

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O1

void __thiscall
expr_packed_struct_array_Test::~expr_packed_struct_array_Test(expr_packed_struct_array_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(expr, packed_struct_array) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");
    auto struct_ =
        std::make_shared<PackedStruct>("data", std::vector<std::tuple<std::string, uint32_t, bool>>{
                                                   {"value1", 1, false}, {"value2", 2, false}});
    auto var_ = std::make_shared<VarPackedStruct>(&mod, "in", struct_, 5);
    auto &var = *var_;

    EXPECT_THROW(var["value1"], UserException);

    auto &slice = var[1];

    auto &s = slice["value2"];
    EXPECT_EQ(s.to_string(), "in[1].value2");

    auto port_ = std::make_shared<PortPackedStruct>(&mod, PortDirection::In, "out", struct_,
                                                    std::vector<uint32_t>{4, 5});
    auto &port = *port_;

    EXPECT_THROW(port["value1"], UserException);
    EXPECT_THROW(port[1]["value1"], UserException);

    auto &s_p = port[1][2]["value1"];
    EXPECT_EQ(s_p.to_string(), "out[1][2].value1");
}